

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
tf::SmallVectorImpl<tf::Node*>::
append<__gnu_cxx::__normal_iterator<tf::Node**,std::vector<tf::Node*,std::allocator<tf::Node*>>>>
          (SmallVectorImpl<tf::Node*> *this,
          __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
          in_start,__normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
                   in_end)

{
  ulong uVar1;
  iterator ppNVar2;
  iterator ppNVar3;
  size_type sVar4;
  size_type NumInputs;
  SmallVectorImpl<tf::Node_*> *this_local;
  __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_> in_end_local
  ;
  __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
  in_start_local;
  
  uVar1 = std::
          distance<__gnu_cxx::__normal_iterator<tf::Node**,std::vector<tf::Node*,std::allocator<tf::Node*>>>>
                    (in_start,in_end);
  ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::capacity_ptr
                      ((SmallVectorTemplateCommon<tf::Node_*,_void> *)this);
  ppNVar3 = SmallVectorTemplateCommon<tf::Node_*,_void>::end
                      ((SmallVectorTemplateCommon<tf::Node_*,_void> *)this);
  if ((ulong)((long)ppNVar2 - (long)ppNVar3 >> 3) < uVar1) {
    sVar4 = SmallVectorTemplateCommon<tf::Node_*,_void>::size
                      ((SmallVectorTemplateCommon<tf::Node_*,_void> *)this);
    SmallVectorTemplateBase<tf::Node_*,_true>::grow
              ((SmallVectorTemplateBase<tf::Node_*,_true> *)this,sVar4 + uVar1);
  }
  ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::end
                      ((SmallVectorTemplateCommon<tf::Node_*,_void> *)this);
  SmallVectorTemplateBase<tf::Node*,true>::
  uninitialized_copy<__gnu_cxx::__normal_iterator<tf::Node**,std::vector<tf::Node*,std::allocator<tf::Node*>>>,tf::Node**>
            (in_start,in_end,ppNVar2);
  ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::end
                      ((SmallVectorTemplateCommon<tf::Node_*,_void> *)this);
  SmallVectorTemplateCommon<tf::Node_*,_void>::setEnd
            ((SmallVectorTemplateCommon<tf::Node_*,_void> *)this,ppNVar2 + uVar1);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > size_type(this->capacity_ptr()-this->end()))
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->setEnd(this->end() + NumInputs);
  }